

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MACD_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int unaff_EBX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int *in_stack_00000010;
  int *in_stack_00000018;
  double *in_stack_00000020;
  
  TVar1 = TA_MACD(unaff_EBX,(int)((ulong)in_RDI >> 0x20),(double *)CONCAT44(in_ESI,in_EDX),
                  (int)((ulong)in_RCX >> 0x20),(int)in_RCX,(int)((ulong)in_R8 >> 0x20),
                  in_stack_00000010,in_stack_00000018,in_stack_00000020,(double *)outNBElement,
                  (double *)outBegIdx);
  return TVar1;
}

Assistant:

TA_RetCode TA_MACD_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MACD(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inReal, /* inReal */
/* Generated */              params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */              params->optIn[1].data.optInInteger, /* optInSlowPeriod*/
/* Generated */              params->optIn[2].data.optInInteger, /* optInSignalPeriod*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal, /*  outMACD */
/* Generated */              params->out[1].data.outReal, /*  outMACDSignal */
/* Generated */              params->out[2].data.outReal /*  outMACDHist */ );
/* Generated */ }